

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O0

void __thiscall
student::student(student *this,string *a_name,vector<int,_std::allocator<int>_> *a_score)

{
  vector<int,_std::allocator<int>_> *a_score_local;
  string *a_name_local;
  student *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)a_name);
  std::vector<int,_std::allocator<int>_>::vector(&this->scores,a_score);
  return;
}

Assistant:

student(const std::string &a_name,const std::vector<int> &a_score) : name(a_name), scores(a_score) { }